

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O1

void tlx::
     SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
     ::destroy_array(CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *array,size_t size)

{
  file *pfVar1;
  long lVar2;
  
  if (array != (CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)0x0) {
    pfVar1 = array[-1].ptr_;
    if (pfVar1 != (file *)0x0) {
      lVar2 = (long)pfVar1 * 8;
      do {
        CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::dec_reference
                  ((CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)
                   ((long)&array[-1].ptr_ + lVar2));
        lVar2 = lVar2 + -8;
      } while (lVar2 != 0);
    }
    operator_delete__(array + -1,(long)pfVar1 * 8 + 8);
    return;
  }
  return;
}

Assistant:

static void destroy_array(ValueType* array, size_t size) {
        switch (Mode)
        {
        case SimpleVectorMode::Normal:
            // with normal object destruction
            delete[] array;
            return;
        case SimpleVectorMode::NoInitButDestroy:
            // destroy objects and deallocate memory
            for (size_t i = 0; i < size; ++i)
                array[i].~ValueType();
            operator delete (array);
            return;
        case SimpleVectorMode::NoInitNoDestroy:
            // only deallocate memory
            operator delete (array);
            return;
        }
        abort();
    }